

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelSizeCase::checkTextureState
          (TextureLevelSizeCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  int level;
  deUint32 internalFormat;
  GLenum pname;
  bool bVar1;
  pointer pTVar2;
  pointer pTVar3;
  long lVar4;
  bool bVar5;
  int refValue;
  int levelNdx;
  long lVar6;
  TextureFormat format;
  IVec4 channelBitDepth;
  
  pTVar3 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar3 == pTVar2) {
    bVar5 = verifyTextureLevelParameterEqual
                      (gl,spec->queryTarget,0,this->m_pname,0,(this->super_TextureLevelCase).m_type)
    ;
    return bVar5;
  }
  bVar5 = true;
  lVar4 = 0x10;
  lVar6 = 0;
  do {
    if ((int)(((long)pTVar2 - (long)pTVar3) / 0x18) <= lVar6) {
      return bVar5;
    }
    level = *(int *)((long)pTVar3 + lVar4 + -4);
    internalFormat = *(deUint32 *)((long)&pTVar3->width + lVar4);
    format = glu::mapGLInternalFormat(internalFormat);
    tcu::getTextureFormatBitDepth((tcu *)&channelBitDepth,&format);
    pname = this->m_pname;
    refValue = 0;
    switch(pname) {
    case 0x805c:
      if ((format.order < sBGR) && ((0xcba1U >> (format.order & (sBGR|sRGBA)) & 1) != 0)) {
LAB_0129f941:
        refValue = channelBitDepth.m_data[0];
      }
      break;
    case 0x805d:
      if ((format.order < sBGR) && ((0xcba0U >> (format.order & (sBGR|sRGBA)) & 1) != 0)) {
        refValue = channelBitDepth.m_data[1];
      }
      break;
    case 0x805e:
      if ((format.order < sBGR) && ((0xcb80U >> (format.order & (sBGR|sRGBA)) & 1) != 0)) {
        refValue = channelBitDepth.m_data[2];
      }
      break;
    case 0x805f:
      if ((format.order < sBGR) && ((0x8b00U >> (format.order & (sBGR|sRGBA)) & 1) != 0)) {
LAB_0129f95a:
        refValue = channelBitDepth.m_data[3];
      }
      break;
    default:
      if (pname == 0x884a) {
        if ((format.order == DS) || (format.order == D)) goto LAB_0129f941;
      }
      else if (pname == 0x88f1) {
        refValue = 0;
        if (format.order == DS) goto LAB_0129f95a;
      }
      else {
        refValue = 0;
        if (pname == 0x8c3f) {
          refValue = (uint)(internalFormat == 0x8c3d) * 5;
        }
      }
    }
    bVar1 = verifyTextureLevelParameterGreaterOrEqual
                      (gl,spec->queryTarget,level,pname,refValue,
                       (this->super_TextureLevelCase).m_type);
    bVar5 = bVar5 && bVar1;
    lVar6 = lVar6 + 1;
    pTVar3 = (spec->levels).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (spec->levels).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar4 = lVar4 + 0x18;
  } while( true );
}

Assistant:

bool TextureLevelSizeCase::checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
{
	bool allOk = true;

	if (spec.levels.empty())
	{
		allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, 0, m_pname, 0, m_type);
	}
	else
	{
		for (int levelNdx = 0; levelNdx < (int)spec.levels.size(); ++levelNdx)
		{
			const int queryLevel	= spec.levels[levelNdx].level;
			const int refValue		= getMinimumComponentResolution(spec.levels[levelNdx].internalFormat);

			allOk &= verifyTextureLevelParameterGreaterOrEqual(gl, spec.queryTarget, queryLevel, m_pname, refValue, m_type);
		}
	}

	return allOk;
}